

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat2Expanded
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1)

{
  bool bVar1;
  qpTestResult qVar2;
  GLint64 GVar3;
  GLint64 GVar4;
  GLint64 GVar5;
  long (*palVar6) [2];
  TestLog *this_00;
  MessageBuilder *pMVar7;
  Hex<16UL> local_238;
  Hex<16UL> local_230;
  Hex<16UL> local_228;
  Hex<16UL> local_220;
  Hex<16UL> local_218;
  Hex<16UL> local_210 [3];
  MessageBuilder local_1f8;
  undefined1 local_78 [8];
  StateQueryMemoryWriteGuard<long[2]> floatVector2;
  GLint64 referenceAsGLintMax [2];
  GLint64 referenceAsGLintMin [2];
  GLfloat reference1_local;
  GLfloat reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  GVar3 = anon_unknown_0::expandGLFloatToInteger(reference0);
  GVar4 = anon_unknown_0::expandGLFloatToInteger(reference1);
  GVar5 = anon_unknown_0::expandGLFloatToInteger(reference0);
  floatVector2.m_postguard[1] = GVar5 + 0x7ff;
  GVar5 = anon_unknown_0::expandGLFloatToInteger(reference1);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long[2]> *)local_78);
  palVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_78);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*palVar6);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long[2]> *)local_78,testCtx);
  if ((bVar1) &&
     ((((palVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_78),
        (*palVar6)[0] < GVar3 + -0x7ff ||
        (palVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_78),
        floatVector2.m_postguard[1] < (*palVar6)[0])) ||
       (palVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_78),
       (*palVar6)[1] < GVar4 + -0x7ff)) ||
      (palVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_78),
      GVar5 + 0x7ff < (*palVar6)[1])))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1f8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1f8,(char (*) [30])"// ERROR: expected in ranges ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xae1a1a);
    local_210[0] = tcu::toHex<long>(GVar3 + -0x7ff);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_210);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xb0d2b5);
    local_218 = tcu::toHex<long>(floatVector2.m_postguard[1]);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_218);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0xac8ee9);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xae1a1a);
    local_220 = tcu::toHex<long>(GVar4 + -0x7ff);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_220);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xb0d2b5);
    local_228 = tcu::toHex<long>(GVar5 + 0x7ff);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_228);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xacaf61);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0xad9ec2);
    palVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_78);
    local_230 = tcu::toHex<long>((*palVar6)[0]);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_230);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0xafd70f);
    palVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_78);
    local_238 = tcu::toHex<long>((*palVar6)[1]);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_238);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0xb0d2b5);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat2Expanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1)
{
	DE_ASSERT(de::inRange(reference0, -1.0f, 1.0f));
	DE_ASSERT(de::inRange(reference1, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 referenceAsGLintMin[] =
	{
		expandGLFloatToInteger(reference0) - FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) - FLOAT_EXPANSION_E_64
	};
	const GLint64 referenceAsGLintMax[] =
	{
		expandGLFloatToInteger(reference0) + FLOAT_EXPANSION_E_64,
		expandGLFloatToInteger(reference1) + FLOAT_EXPANSION_E_64
	};

	StateQueryMemoryWriteGuard<GLint64[2]> floatVector2;
	glGetInteger64v(name, floatVector2);

	if (!floatVector2.verifyValidity(testCtx))
		return;

	if (floatVector2[0] < referenceAsGLintMin[0] || floatVector2[0] > referenceAsGLintMax[0] ||
		floatVector2[1] < referenceAsGLintMin[1] || floatVector2[1] > referenceAsGLintMax[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in ranges "
			<< "[" << toHex(referenceAsGLintMin[0]) << " " << toHex(referenceAsGLintMax[0]) << "], "
			<< "[" << toHex(referenceAsGLintMin[1]) << " " << toHex(referenceAsGLintMax[1]) << "]"
			<< "; got "
			<< toHex(floatVector2[0]) << ", "
			<< toHex(floatVector2[1]) << " "<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}